

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O3

void __thiscall
SQInstance::SQInstance(SQInstance *this,SQSharedState *ss,SQClass *c,SQInteger memsize)

{
  long *plVar1;
  SQUnsignedInteger *pSVar2;
  uint uVar3;
  SQClassMember *pSVar4;
  long lVar5;
  SQUnsignedInteger SVar6;
  long lVar7;
  
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef = 0;
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQInstance_00142810;
  this->_values[0].super_SQObject._type = OT_NULL;
  this->_values[0].super_SQObject._unVal.pTable = (SQTable *)0x0;
  this->_memsize = memsize;
  this->_class = c;
  SVar6 = (c->_defaultvalues)._size;
  if (SVar6 != 0) {
    lVar7 = 0;
    do {
      pSVar4 = (c->_defaultvalues)._vals;
      uVar3 = *(uint *)((long)&(pSVar4->val).super_SQObject._type + lVar7 * 2);
      *(uint *)((long)&this->_values[0].super_SQObject._type + lVar7) = uVar3;
      lVar5 = *(long *)((long)&(pSVar4->val).super_SQObject._unVal + lVar7 * 2);
      *(long *)((long)&this->_values[0].super_SQObject._unVal + lVar7) = lVar5;
      if ((uVar3 >> 0x1b & 1) != 0) {
        plVar1 = (long *)(lVar5 + 8);
        *plVar1 = *plVar1 + 1;
      }
      lVar7 = lVar7 + 0x10;
      SVar6 = SVar6 - 1;
    } while (SVar6 != 0);
  }
  this->_userpointer = (SQUserPointer)0x0;
  this->_hook = (SQRELEASEHOOK)0x0;
  pSVar2 = &(c->super_SQCollectable).super_SQRefCounted._uiRef;
  *pSVar2 = *pSVar2 + 1;
  (this->super_SQDelegable)._delegate = c->_members;
  (this->super_SQDelegable).super_SQCollectable._next = (SQCollectable *)0x0;
  (this->super_SQDelegable).super_SQCollectable._prev = (SQCollectable *)0x0;
  (this->super_SQDelegable).super_SQCollectable._sharedstate = ss;
  SQCollectable::AddToChain(&ss->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQInstance::SQInstance(SQSharedState *ss, SQClass *c, SQInteger memsize)
{
    _memsize = memsize;
    _class = c;
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    for(SQUnsignedInteger n = 0; n < nvalues; n++) {
        new (&_values[n]) SQObjectPtr(_class->_defaultvalues[n].val);
    }
    Init(ss);
}